

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

void __thiscall minihttp::HttpSocket::_OnData(HttpSocket *this)

{
  uint size;
  byte bVar1;
  char *buf;
  
  bVar1 = this->_chunkedTransfer;
  if (((bool)bVar1 == false) &&
     ((this->_remaining == 0 || ((this->super_TcpSocket)._recvSize == 0)))) {
    _ParseHeader(this);
    bVar1 = this->_chunkedTransfer;
  }
  if ((bVar1 & 1) != 0) {
    _ProcessChunk(this);
    return;
  }
  if ((this->_remaining == 0) || (size = (this->super_TcpSocket)._recvSize, size == 0)) {
    return;
  }
  this->_remaining = this->_remaining - size;
  buf = (this->super_TcpSocket)._readptr;
  _OnRecvInternal(this,buf,size);
  if ((int)this->_remaining < 0) {
    this->_remaining = 0;
  }
  else if (this->_remaining != 0) {
    return;
  }
  if (this->_mustClose != true) {
    _DequeueMore(this);
    return;
  }
  TcpSocket::close(&this->super_TcpSocket,(int)buf);
  return;
}

Assistant:

void HttpSocket::_OnData(void)
{
    if(!(_chunkedTransfer || (_remaining && _recvSize)))
        _ParseHeader();

    if(_chunkedTransfer)
    {
        _ProcessChunk(); // first, try to finish one or more chunks
    }
    else if(_remaining && _recvSize) // something remaining? if so, we got a header earlier, but not all data
    {
        _remaining -= _recvSize;
        _OnRecvInternal(_readptr, _recvSize);

        if(int(_remaining) < 0)
        {
            traceprint("_OnRecv: _remaining wrap-around, huh??\n");
            _remaining = 0;
        }
        if(!_remaining) // received last block?
        {
            if(_mustClose)
                close();
            else
                _DequeueMore();
        }

        // nothing else to do here.
    }

    // otherwise, the server sent just the header, with the data following in the next packet
}